

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  stbi__uint16 sVar2;
  uint uVar3;
  stbi__uint16 *psVar4;
  undefined8 *puVar5;
  int iVar6;
  stbi__uint16 *psVar7;
  ushort *puVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  
  psVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                    ,0x6b5,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar4 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar4 == (stbi__uint16 *)0x0) {
      free(data);
      puVar5 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
      *puVar5 = "outofmem";
      psVar4 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar3 = req_comp + img_n * 8;
        if ((0x23 < uVar3) || ((0xe161a1c00U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                        ,0x6d2,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar6 = x - 1;
        uVar12 = 0;
        uVar13 = 0;
        uVar9 = 0;
        do {
          iVar10 = (int)uVar9 * x;
          if (uVar3 - 10 < 0x19) {
            puVar8 = data + (uint)(iVar10 * img_n);
            switch(uVar3) {
            case 10:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  psVar4[uVar13 + lVar11 * 2] = data[uVar12 + lVar11];
                  psVar4[uVar13 + lVar11 * 2 + 1] = 0xffff;
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
              break;
            case 0xb:
              if (-1 < iVar6) {
                psVar7 = psVar4 + uVar13 + 2;
                lVar11 = 0;
                do {
                  sVar2 = data[uVar12 + lVar11];
                  *psVar7 = sVar2;
                  psVar7[-1] = sVar2;
                  psVar7[-2] = sVar2;
                  lVar11 = lVar11 + 1;
                  psVar7 = psVar7 + 3;
                } while (x != (uint)lVar11);
              }
              break;
            case 0xc:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = (ulong)data[uVar12 + lVar11] | 0xffff0000;
                  auVar14 = pshuflw(auVar14,auVar14,0x40);
                  *(long *)(psVar4 + uVar13 + lVar11 * 4) = auVar14._0_8_;
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
              break;
            default:
              goto switchD_0011c2fe_caseD_d;
            case 0x11:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  psVar4[uVar13 + lVar11] = data[uVar12 + lVar11 * 2];
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x13:
              if (-1 < iVar6) {
                psVar7 = psVar4 + uVar13 + 2;
                lVar11 = 0;
                do {
                  sVar2 = data[uVar12 + lVar11 * 2];
                  *psVar7 = sVar2;
                  psVar7[-1] = sVar2;
                  psVar7[-2] = sVar2;
                  lVar11 = lVar11 + 1;
                  psVar7 = psVar7 + 3;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x14:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  auVar14 = pshuflw(ZEXT416(*(uint *)(data + uVar12 + lVar11 * 2)),
                                    ZEXT416(*(uint *)(data + uVar12 + lVar11 * 2)),0x40);
                  *(long *)(psVar4 + uVar13 + lVar11 * 4) = auVar14._0_8_;
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x19:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  uVar1 = puVar8[2];
                  psVar4[uVar13 + lVar11] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)puVar8[1] * 0x96 + (uint)*puVar8 * 0x4d >> 8);
                  lVar11 = lVar11 + 1;
                  puVar8 = puVar8 + 3;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x1a:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  uVar1 = puVar8[2];
                  psVar4[uVar13 + lVar11 * 2] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)puVar8[1] * 0x96 + (uint)*puVar8 * 0x4d >> 8);
                  psVar4[uVar13 + lVar11 * 2 + 1] = 0xffff;
                  lVar11 = lVar11 + 1;
                  puVar8 = puVar8 + 3;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x1c:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  *(undefined4 *)(psVar4 + uVar13 + lVar11 * 4) = *(undefined4 *)puVar8;
                  psVar4[uVar13 + lVar11 * 4 + 2] = puVar8[2];
                  psVar4[uVar13 + lVar11 * 4 + 3] = 0xffff;
                  lVar11 = lVar11 + 1;
                  puVar8 = puVar8 + 3;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x21:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  uVar1 = data[uVar12 + lVar11 * 4 + 2];
                  psVar4[uVar13 + lVar11] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)data[uVar12 + lVar11 * 4 + 1] * 0x96 +
                        (uint)data[uVar12 + lVar11 * 4] * 0x4d >> 8);
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
              break;
            case 0x22:
              if (-1 < iVar6) {
                lVar11 = 0;
                do {
                  uVar1 = data[uVar12 + lVar11 * 4 + 2];
                  psVar4[uVar13 + lVar11 * 2] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)data[uVar12 + lVar11 * 4 + 1] * 0x96 +
                        (uint)data[uVar12 + lVar11 * 4] * 0x4d >> 8);
                  psVar4[uVar13 + lVar11 * 2 + 1] = data[uVar12 + lVar11 * 4 + 3];
                  lVar11 = lVar11 + 1;
                } while (x != (uint)lVar11);
              }
            }
          }
          else {
switchD_0011c2fe_caseD_d:
            if (-1 < iVar6) {
              psVar7 = psVar4 + (uint)(iVar10 * req_comp);
              lVar11 = 0;
              do {
                *(undefined4 *)psVar7 = *(undefined4 *)(data + uVar12 + lVar11 * 4);
                psVar7[2] = data[uVar12 + lVar11 * 4 + 2];
                lVar11 = lVar11 + 1;
                psVar7 = psVar7 + 3;
              } while (x != (uint)lVar11);
            }
          }
          uVar9 = uVar9 + 1;
          uVar13 = (ulong)((int)uVar13 + req_comp * x);
          uVar12 = (ulong)((int)uVar12 + x * img_n);
        } while (uVar9 != y);
      }
      free(data);
    }
  }
  return psVar4;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}